

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guarded.hpp
# Opt level: O3

conditional_t<std::is_copy_assignable<pair<bool,_bool>_>::value,_std::pair<bool,_bool>,_void>
__thiscall
gmlc::libguarded::guarded<std::pair<bool,_bool>,_std::mutex>::load
          (guarded<std::pair<bool,_bool>,_std::mutex> *this)

{
  conditional_t<std::is_copy_assignable<pair<bool,_bool>_>::value,_std::pair<bool,_bool>,_void>
  cVar1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_mutex);
  if (iVar2 == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
    cVar1.first = (this->m_obj).first;
    cVar1.second = (this->m_obj).second;
    return cVar1;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

std::conditional_t<std::is_copy_assignable<T>::value, T, void> load()
    {
        std::lock_guard<M> glock(m_mutex);
        auto retObj =
            std::conditional_t<std::is_copy_assignable<T>::value, T, void>(
                m_obj);
        return retObj;
    }